

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O3

void __thiscall
phmap::priv::
btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
::uninitialized_move_n
          (btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
           *this,size_type n,size_type i,size_type j,
          btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
          *x,allocator_type *alloc)

{
  btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
  *pbVar1;
  long lVar2;
  
  if ((((ulong)x & 7) == 0) && (((ulong)this & 7) == 0)) {
    if (n != 0) {
      lVar2 = 0x10;
      do {
        pbVar1 = this + lVar2 + i * 0x10;
        *(undefined8 *)(x + lVar2 + j * 0x10) = *(undefined8 *)pbVar1;
        x[lVar2 + j * 0x10 + 8] = pbVar1[8];
        pbVar1[8] = (btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
                     )0x0;
        test_internal::BaseCountedInstance::num_instances_ =
             test_internal::BaseCountedInstance::num_instances_ + 1;
        test_internal::BaseCountedInstance::num_moves_ =
             test_internal::BaseCountedInstance::num_moves_ + 1;
        lVar2 = lVar2 + 0x10;
      } while (pbVar1 + 0x10 != this + n * 0x10 + i * 0x10 + 0x10);
    }
    return;
  }
  __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap_base.h"
                ,0xf84,
                "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, phmap::priv::(anonymous namespace)::MovableOnlyInstanceThreeWayCompare, std::allocator<phmap::test_internal::MovableOnlyInstance>, 1616, false>> *, unsigned char, phmap::test_internal::MovableOnlyInstance, phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, phmap::priv::(anonymous namespace)::MovableOnlyInstanceThreeWayCompare, std::allocator<phmap::test_internal::MovableOnlyInstance>, 1616, false>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, phmap::priv::(anonymous namespace)::MovableOnlyInstanceThreeWayCompare, std::allocator<phmap::test_internal::MovableOnlyInstance>, 1616, false>> *, unsigned char, phmap::test_internal::MovableOnlyInstance, phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, phmap::priv::(anonymous namespace)::MovableOnlyInstanceThreeWayCompare, std::allocator<phmap::test_internal::MovableOnlyInstance>, 1616, false>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 2UL, Char = char]"
               );
}

Assistant:

void uninitialized_move_n(const size_type n, const size_type i,
                                  const size_type j, btree_node *x,
                                  allocator_type *alloc) {
            phmap::priv::SanitizerUnpoisonMemoryRegion(
                x->slot(j), n * sizeof(slot_type));
            for (slot_type *src = slot(i), *end = src + n, *dest = x->slot(j);
                 src != end; ++src, ++dest) {
                params_type::construct(alloc, dest, src);
            }
        }